

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O3

void EntityRelationTask::er_mixed_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  v_array<unsigned_long> *pvVar6;
  v_array<unsigned_long> *extraout_RDX;
  v_array<unsigned_long> *extraout_RDX_00;
  int iVar7;
  ptag my_tag;
  ulong uVar8;
  ptag pVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [16];
  
  lVar3 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    lVar3 = lVar3 + 1;
    auVar12._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar12._0_8_ = lVar3;
    auVar12._12_4_ = 0x45300000;
    uVar1 = (uint)(long)((SQRT((auVar12._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) +
                         -1.0) * 0.5);
    uVar8 = 0;
    pvVar6 = predictions;
    do {
      iVar11 = (int)uVar8;
      if (uVar1 != 0) {
        uVar8 = 0;
        iVar2 = 0;
        iVar7 = uVar1 - 1;
        do {
          my_tag = (ptag)uVar8;
          if (iVar2 == iVar11) {
            sVar4 = predict_entity(sch,(ec->
                                       super__Vector_base<example_*,_std::allocator<example_*>_>).
                                       _M_impl.super__Vector_impl_data._M_start[uVar8],pvVar6,my_tag
                                   ,false);
            predictions->_begin[uVar8] = sVar4;
            pvVar6 = extraout_RDX_00;
            break;
          }
          iVar2 = iVar2 + 1;
          if (my_tag != 0) {
            uVar5 = 0;
            pvVar6 = (v_array<unsigned_long> *)(ulong)(uVar1 * 2 - 2);
            pVar9 = 0;
            iVar10 = iVar7;
            do {
              if (iVar11 == iVar2) {
                uVar5 = iVar10 + (uVar5 >> 1);
                sVar4 = predict_relation(sch,(ec->
                                             super__Vector_base<example_*,_std::allocator<example_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar5],
                                         predictions,uVar5,false);
                predictions->_begin[uVar5] = sVar4;
                pvVar6 = extraout_RDX;
                iVar2 = iVar11;
                break;
              }
              pVar9 = pVar9 + 1;
              iVar2 = iVar2 + 1;
              iVar10 = iVar10 + -1;
              uVar5 = uVar5 + (int)pvVar6;
              pvVar6 = (v_array<unsigned_long> *)(ulong)((int)pvVar6 - 2);
            } while (my_tag != pVar9);
          }
          uVar8 = (ulong)(my_tag + 1);
          iVar7 = iVar7 + 1;
        } while (my_tag + 1 != uVar1);
      }
      uVar8 = (ulong)(iVar11 + 1);
    } while (uVar8 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void er_mixed_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions)
{
  // ec.size = #entity + #entity*(#entity-1)/2
  uint32_t n_ent = (uint32_t)((sqrt(ec.size() * 8 + 1) - 1) / 2);
  for (uint32_t t = 0; t < ec.size(); t++)
  {
    // Do entity recognition first
    uint32_t count = 0;
    for (ptag i = 0; i < n_ent; i++)
    {
      if (count == t)
      {
        predictions[i] = predict_entity(sch, ec[i], predictions, i);
        break;
      }
      count++;
      for (uint32_t j = 0; j < i; j++)
      {
        if (count == t)
        {
          ptag rel_index = (ptag)(n_ent + (2 * n_ent - j - 1) * j / 2 + i - j - 1);
          predictions[rel_index] = predict_relation(sch, ec[rel_index], predictions, rel_index);
          break;
        }
        count++;
      }
    }
  }
}